

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall
cmGraphVizWriter::WriteConnection
          (cmGraphVizWriter *this,cmGeneratedFileStream *fs,cmLinkItem *depender,
          cmLinkItem *dependee,string *edgeStyle)

{
  string *__k;
  string *__k_00;
  mapped_type *pmVar1;
  ostream *poVar2;
  char local_29;
  
  __k = cmLinkItem::AsStr_abi_cxx11_(depender);
  __k_00 = cmLinkItem::AsStr_abi_cxx11_(dependee);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fs,"    \"",5);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->NodeNames,__k);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fs,(pmVar1->_M_dataplus)._M_p,pmVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" -> \"",6);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->NodeNames,__k_00);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(pmVar1->_M_dataplus)._M_p,pmVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(edgeStyle->_M_dataplus)._M_p,edgeStyle->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," // ",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(__k->_M_dataplus)._M_p,__k->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(__k_00->_M_dataplus)._M_p,__k_00->_M_string_length);
  local_29 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_29,1);
  return;
}

Assistant:

void cmGraphVizWriter::WriteConnection(cmGeneratedFileStream& fs,
                                       cmLinkItem const& depender,
                                       cmLinkItem const& dependee,
                                       std::string const& edgeStyle)
{
  auto const& dependerName = depender.AsStr();
  auto const& dependeeName = dependee.AsStr();

  fs << "    \"" << this->NodeNames[dependerName] << "\" -> \""
     << this->NodeNames[dependeeName] << "\" "
     << edgeStyle
     << " // " << dependerName << " -> " << dependeeName << '\n';
}